

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

string * __thiscall
helics::CoreBroker::generateRename_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view name)

{
  bool bVar1;
  uint uVar2;
  size_type __pos;
  iterator iVar3;
  ulong uVar4;
  uint __len;
  ulong uVar5;
  ulong __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_t local_40;
  char *local_38;
  
  local_38 = name._M_str;
  local_40 = name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,local_38 + local_40);
  __pos = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (__return_storage_ptr__,"${#}",0,4);
  if (__pos != 0xffffffffffffffff) {
    iVar3 = CLI::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->renamers)._M_h,__return_storage_ptr__);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (__return_storage_ptr__,__pos,4,"1",1);
      local_60._M_dataplus._M_p._0_4_ = 1;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&,int>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->renamers,&local_40);
    }
    else {
      uVar5 = *(long *)((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                              ._M_cur + 0x28) + 1;
      __val = -uVar5;
      if (0 < (long)uVar5) {
        __val = uVar5;
      }
      __len = 1;
      if (9 < __val) {
        uVar4 = __val;
        uVar2 = 4;
        do {
          __len = uVar2;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_003301c3;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_003301c3;
          }
          if (uVar4 < 10000) goto LAB_003301c3;
          bVar1 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          uVar2 = __len + 4;
        } while (bVar1);
        __len = __len + 1;
      }
LAB_003301c3:
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_60,(ulong)(__len - (int)((long)uVar5 >> 0x3f)),'-');
      CLI::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_60._M_dataplus._M_p + -((long)uVar5 >> 0x3f),__len,__val);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (__return_storage_ptr__,__pos,4,local_60._M_dataplus._M_p,local_60._M_string_length)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      *(long *)((long)iVar3.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                      ._M_cur + 0x28) =
           *(long *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                           ._M_cur + 0x28) + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::generateRename(std::string_view name)
{
    std::string newName{name};
    auto cntLoc = newName.find("${#}");
    if (cntLoc != std::string::npos) {
        auto renamer = renamers.find(newName);
        if (renamer != renamers.end()) {
            newName.replace(cntLoc, 4, std::to_string(renamer->second + 1));
            renamer->second++;
        } else {
            newName.replace(cntLoc, 4, "1");
            renamers.emplace(name, 1);
        }
    }
    return newName;
}